

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int read_function_entry(backtrace_state *state,dwarf_data *ddata,unit *u,uintptr_t base,
                       dwarf_buf *unit_buf,line_header *lhdr,backtrace_error_callback error_callback
                       ,void *data,function_vector *vec_function,function_vector *vec_inlined)

{
  dwarf_sections *dwarf_sections;
  dwarf_tag dVar1;
  bool bVar2;
  undefined8 abbrevs;
  uintptr_t base_00;
  undefined1 auVar3 [8];
  int iVar4;
  uint64_t code;
  abbrev *paVar5;
  char *pcVar6;
  undefined4 *puVar7;
  attr *attr;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  undefined1 auStack_e8 [8];
  pcrange pcrange;
  char *local_a8;
  char *s;
  line_header *local_98;
  uintptr_t local_90;
  uintptr_t base_local;
  undefined8 local_80;
  undefined1 auStack_78 [8];
  attr_val val;
  size_t sStack_60;
  undefined1 (*local_38) [16];
  
  pcrange._48_8_ = &u->abbrevs;
  dwarf_sections = &ddata->dwarf_sections;
  local_98 = lhdr;
  local_90 = base;
  base_local = (uintptr_t)unit_buf;
LAB_0012b22c:
  do {
    abbrevs = pcrange._48_8_;
    if (unit_buf->left == 0) {
      return 1;
    }
    code = read_uleb128(unit_buf);
    if (code == 0) {
      return 1;
    }
    paVar5 = lookup_abbrev((abbrevs *)abbrevs,code,error_callback,data);
    if (paVar5 == (abbrev *)0x0) {
      return 0;
    }
    dVar1 = paVar5->tag;
    local_80 = 0;
    if ((ulong)dVar1 < 0x2f) {
      s = (char *)vec_function;
      bVar2 = false;
      local_38 = (undefined1 (*) [16])0x0;
      if ((0x400020000008U >> ((ulong)dVar1 & 0x3f) & 1) != 0) {
        local_38 = (undefined1 (*) [16])tcmalloc_backtrace_alloc(state,0x28,error_callback,data);
        if (local_38 == (undefined1 (*) [16])0x0) {
          return 0;
        }
        s = (char *)vec_function;
        if (dVar1 == DW_TAG_inlined_subroutine) {
          s = (char *)vec_inlined;
        }
        local_38[1] = (undefined1  [16])0x0;
        *local_38 = (undefined1  [16])0x0;
        *(undefined8 *)local_38[2] = 0;
        bVar2 = true;
      }
    }
    else {
      s = (char *)vec_function;
      bVar2 = false;
      local_38 = (undefined1 (*) [16])0x0;
    }
    pcrange.have_highpc = 0;
    pcrange.highpc_is_relative = 0;
    pcrange.highpc_is_addr_index = 0;
    pcrange._36_4_ = 0;
    pcrange.ranges = 0;
    pcrange.have_lowpc = 0;
    pcrange.lowpc_is_addr_index = 0;
    pcrange.highpc = 0;
    _auStack_e8 = (undefined1  [16])0x0;
    lVar9 = 0;
    for (uVar8 = 0; base_00 = local_90, uVar8 < paVar5->num_attrs; uVar8 = uVar8 + 1) {
      iVar4 = read_attribute(*(dwarf_form *)((long)&paVar5->attrs->form + lVar9),
                             *(uint64_t *)((long)&paVar5->attrs->val + lVar9),
                             (dwarf_buf *)base_local,u->is_dwarf64,u->version,u->addrsize,
                             dwarf_sections,ddata->altlink,(attr_val *)auStack_78);
      if (iVar4 == 0) {
        return 0;
      }
      if (((paVar5->tag == DW_TAG_skeleton_unit) || (paVar5->tag == DW_TAG_compile_unit)) &&
         (*(int *)((long)&paVar5->attrs->name + lVar9) == 0x11)) {
        if (auStack_78._0_4_ == ATTR_VAL_ADDRESS_INDEX) {
          iVar4 = resolve_addr_index(dwarf_sections,u->addr_base,u->addrsize,ddata->is_bigendian,
                                     val._0_8_,error_callback,data,&local_90);
          if (iVar4 == 0) {
            return 0;
          }
        }
        else if (auStack_78._0_4_ == ATTR_VAL_ADDRESS) {
          local_90 = val._0_8_;
        }
      }
      if (bVar2) {
        iVar4 = *(int *)((long)&paVar5->attrs->name + lVar9);
        attr = (attr *)((long)&paVar5->attrs->name + lVar9);
        if (iVar4 - 0x11U < 2) {
LAB_0012b460:
          update_pcrange(attr,(attr_val *)auStack_78,(pcrange *)auStack_e8);
        }
        else if (iVar4 == 3) {
          if ((*(long *)*local_38 == 0) &&
             (iVar4 = resolve_string(dwarf_sections,u->is_dwarf64,ddata->is_bigendian,
                                     u->str_offsets_base,(attr_val *)auStack_78,error_callback,data,
                                     (char **)local_38), iVar4 == 0)) {
            return 0;
          }
        }
        else if ((iVar4 == 0x31) || (iVar4 == 0x47)) {
          bVar10 = (int)local_80 == 0;
          local_80 = 1;
          if (bVar10) {
            pcVar6 = read_referenced_name_from_attr
                               (ddata,u,attr,(attr_val *)auStack_78,error_callback,data);
            local_80 = 0;
            if (pcVar6 != (char *)0x0) {
              *(char **)*local_38 = pcVar6;
            }
          }
        }
        else {
          if (iVar4 == 0x55) goto LAB_0012b460;
          if (iVar4 == 0x2007) {
LAB_0012b478:
            local_a8 = (char *)0x0;
            iVar4 = resolve_string(dwarf_sections,u->is_dwarf64,ddata->is_bigendian,
                                   u->str_offsets_base,(attr_val *)auStack_78,error_callback,data,
                                   &local_a8);
            if (iVar4 == 0) {
              return 0;
            }
            if (local_a8 != (char *)0x0) {
              *(char **)*local_38 = local_a8;
              local_80 = 1;
            }
          }
          else if (iVar4 == 0x59) {
            if (auStack_78._0_4_ == ATTR_VAL_UINT) {
              *(attr_val_encoding *)local_38[1] = val.encoding;
            }
          }
          else {
            if (iVar4 == 0x6e) goto LAB_0012b478;
            if ((iVar4 == 0x58) && (auStack_78._0_4_ == ATTR_VAL_UINT)) {
              if (local_98->filenames_count <= (ulong)val._0_8_) {
                dwarf_buf_error((dwarf_buf *)base_local,
                                "invalid file number in DW_AT_call_file attribute",0);
                return 0;
              }
              *(char **)(*local_38 + 8) = local_98->filenames[val._0_8_];
            }
          }
        }
      }
      lVar9 = lVar9 + 0x10;
    }
    if (bVar2) {
      if ((*(long *)*local_38 != 0) &&
         (((int)pcrange.ranges != 0 || (((int)pcrange.lowpc != 0 && ((int)pcrange.highpc != 0))))))
      {
        iVar4 = add_ranges(state,dwarf_sections,(libbacktrace_base_address)(ddata->base_address).m,
                           ddata->is_bigendian,u,local_90,(pcrange *)auStack_e8,add_function_range,
                           local_38,error_callback,data,s);
        unit_buf = (dwarf_buf *)base_local;
        if (iVar4 == 0) {
          return 0;
        }
        if (paVar5->has_children != 0) {
          stack0xffffffffffffff98 = (undefined1  [16])0x0;
          auStack_78._0_4_ = ATTR_VAL_NONE;
          auStack_78._4_4_ = 0;
          val._0_8_ = (anon_union_8_3_08205623_for_u)0x0;
          iVar4 = read_function_entry(state,ddata,u,base_00,(dwarf_buf *)base_local,local_98,
                                      error_callback,data,vec_function,(function_vector *)auStack_78
                                     );
          if (iVar4 == 0) {
            return 0;
          }
          if (sStack_60 != 0) {
            puVar7 = (undefined4 *)
                     tcmalloc_backtrace_vector_grow
                               (state,0x18,error_callback,data,(backtrace_vector *)auStack_78);
            if (puVar7 == (undefined4 *)0x0) {
              return 0;
            }
            *puVar7 = 0xffffffff;
            puVar7[1] = 0xffffffff;
            puVar7[2] = 0xffffffff;
            puVar7[3] = 0xffffffff;
            *(undefined8 *)(puVar7 + 4) = 0;
            iVar4 = tcmalloc_backtrace_vector_release
                              (state,(backtrace_vector *)auStack_78,error_callback,data);
            if (iVar4 == 0) {
              return 0;
            }
            auVar3 = auStack_78;
            tcmalloc_backtrace_qsort((void *)auStack_78,sStack_60,0x18,function_addrs_compare);
            *(undefined1 (*) [8])(local_38[1] + 8) = auVar3;
            *(size_t *)local_38[2] = sStack_60;
          }
        }
        goto LAB_0012b22c;
      }
      tcmalloc_backtrace_free(state,local_38,0x28,error_callback,data);
    }
    unit_buf = (dwarf_buf *)base_local;
    if ((paVar5->has_children != 0) &&
       (iVar4 = read_function_entry(state,ddata,u,local_90,(dwarf_buf *)base_local,local_98,
                                    error_callback,data,vec_function,vec_inlined), iVar4 == 0)) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
read_function_entry (struct backtrace_state *state, struct dwarf_data *ddata,
		     struct unit *u, uintptr_t base, struct dwarf_buf *unit_buf,
		     const struct line_header *lhdr,
		     backtrace_error_callback error_callback, void *data,
		     struct function_vector *vec_function,
		     struct function_vector *vec_inlined)
{
  while (unit_buf->left > 0)
    {
      uint64_t code;
      const struct abbrev *abbrev;
      int is_function;
      struct function *function;
      struct function_vector *vec;
      size_t i;
      struct pcrange pcrange;
      int have_linkage_name;

      code = read_uleb128 (unit_buf);
      if (code == 0)
	return 1;

      abbrev = lookup_abbrev (&u->abbrevs, code, error_callback, data);
      if (abbrev == NULL)
	return 0;

      is_function = (abbrev->tag == DW_TAG_subprogram
		     || abbrev->tag == DW_TAG_entry_point
		     || abbrev->tag == DW_TAG_inlined_subroutine);

      if (abbrev->tag == DW_TAG_inlined_subroutine)
	vec = vec_inlined;
      else
	vec = vec_function;

      function = NULL;
      if (is_function)
	{
	  function = ((struct function *)
		      backtrace_alloc (state, sizeof *function,
				       error_callback, data));
	  if (function == NULL)
	    return 0;
	  memset (function, 0, sizeof *function);
	}

      memset (&pcrange, 0, sizeof pcrange);
      have_linkage_name = 0;
      for (i = 0; i < abbrev->num_attrs; ++i)
	{
	  struct attr_val val;

	  if (!read_attribute (abbrev->attrs[i].form, abbrev->attrs[i].val,
			       unit_buf, u->is_dwarf64, u->version,
			       u->addrsize, &ddata->dwarf_sections,
			       ddata->altlink, &val))
	    return 0;

	  /* The compile unit sets the base address for any address
	     ranges in the function entries.  */
	  if ((abbrev->tag == DW_TAG_compile_unit
	       || abbrev->tag == DW_TAG_skeleton_unit)
	      && abbrev->attrs[i].name == DW_AT_low_pc)
	    {
	      if (val.encoding == ATTR_VAL_ADDRESS)
		base = (uintptr_t) val.u.uint;
	      else if (val.encoding == ATTR_VAL_ADDRESS_INDEX)
		{
		  if (!resolve_addr_index (&ddata->dwarf_sections,
					   u->addr_base, u->addrsize,
					   ddata->is_bigendian, val.u.uint,
					   error_callback, data, &base))
		    return 0;
		}
	    }

	  if (is_function)
	    {
	      switch (abbrev->attrs[i].name)
		{
		case DW_AT_call_file:
		  if (val.encoding == ATTR_VAL_UINT)
		    {
		      if (val.u.uint >= lhdr->filenames_count)
			{
			  dwarf_buf_error (unit_buf,
					   ("invalid file number in "
					    "DW_AT_call_file attribute"),
					   0);
			  return 0;
			}
		      function->caller_filename = lhdr->filenames[val.u.uint];
		    }
		  break;

		case DW_AT_call_line:
		  if (val.encoding == ATTR_VAL_UINT)
		    function->caller_lineno = val.u.uint;
		  break;

		case DW_AT_abstract_origin:
		case DW_AT_specification:
		  /* Second name preference: override DW_AT_name, don't override
		     DW_AT_linkage_name.  */
		  if (have_linkage_name)
		    break;
		  {
		    const char *name;

		    name
		      = read_referenced_name_from_attr (ddata, u,
							&abbrev->attrs[i], &val,
							error_callback, data);
		    if (name != NULL)
		      function->name = name;
		  }
		  break;

		case DW_AT_name:
		  /* Third name preference: don't override.  */
		  if (function->name != NULL)
		    break;
		  if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
				       ddata->is_bigendian,
				       u->str_offsets_base, &val,
				       error_callback, data, &function->name))
		    return 0;
		  break;

		case DW_AT_linkage_name:
		case DW_AT_MIPS_linkage_name:
		  /* First name preference: override all.  */
		  {
		    const char *s;

		    s = NULL;
		    if (!resolve_string (&ddata->dwarf_sections, u->is_dwarf64,
					 ddata->is_bigendian,
					 u->str_offsets_base, &val,
					 error_callback, data, &s))
		      return 0;
		    if (s != NULL)
		      {
			function->name = s;
			have_linkage_name = 1;
		      }
		  }
		  break;

		case DW_AT_low_pc: case DW_AT_high_pc: case DW_AT_ranges:
		  update_pcrange (&abbrev->attrs[i], &val, &pcrange);
		  break;

		default:
		  break;
		}
	    }
	}

      /* If we couldn't find a name for the function, we have no use
	 for it.  */
      if (is_function && function->name == NULL)
	{
	  backtrace_free (state, function, sizeof *function,
			  error_callback, data);
	  is_function = 0;
	}

      if (is_function)
	{
	  if (pcrange.have_ranges
	      || (pcrange.have_lowpc && pcrange.have_highpc))
	    {
	      if (!add_ranges (state, &ddata->dwarf_sections,
			       ddata->base_address, ddata->is_bigendian,
			       u, base, &pcrange, add_function_range,
			       (void *) function, error_callback, data,
			       (void *) vec))
		return 0;
	    }
	  else
	    {
	      backtrace_free (state, function, sizeof *function,
			      error_callback, data);
	      is_function = 0;
	    }
	}

      if (abbrev->has_children)
	{
	  if (!is_function)
	    {
	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					vec_inlined))
		return 0;
	    }
	  else
	    {
	      struct function_vector fvec;

	      /* Gather any information for inlined functions in
		 FVEC.  */

	      memset (&fvec, 0, sizeof fvec);

	      if (!read_function_entry (state, ddata, u, base, unit_buf, lhdr,
					error_callback, data, vec_function,
					&fvec))
		return 0;

	      if (fvec.count > 0)
		{
		  struct function_addrs *p;
		  struct function_addrs *faddrs;

		  /* Allocate a trailing entry, but don't include it
		     in fvec.count.  */
		  p = ((struct function_addrs *)
		       backtrace_vector_grow (state,
					      sizeof (struct function_addrs),
					      error_callback, data,
					      &fvec.vec));
		  if (p == NULL)
		    return 0;
		  p->low = 0;
		  --p->low;
		  p->high = p->low;
		  p->function = NULL;

		  if (!backtrace_vector_release (state, &fvec.vec,
						 error_callback, data))
		    return 0;

		  faddrs = (struct function_addrs *) fvec.vec.base;
		  backtrace_qsort (faddrs, fvec.count,
				   sizeof (struct function_addrs),
				   function_addrs_compare);

		  function->function_addrs = faddrs;
		  function->function_addrs_count = fvec.count;
		}
	    }
	}
    }

  return 1;
}